

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void * lua_touserdata(lua_State *L,int idx)

{
  uint uVar1;
  TValue *pTVar2;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  pTVar2 = index2addr(L,idx);
  uVar1 = pTVar2->tt_ & 0xf;
  if (uVar1 == 2) {
    L_local = (lua_State *)(pTVar2->value_).gc;
  }
  else if (uVar1 == 7) {
    L_local = (lua_State *)((pTVar2->value_).f + 0x28);
  }
  else {
    L_local = (lua_State *)0x0;
  }
  return L_local;
}

Assistant:

LUA_API void *lua_touserdata (lua_State *L, int idx) {
  StkId o = index2addr(L, idx);
  switch (ttnov(o)) {
    case LUA_TUSERDATA: return getudatamem(uvalue(o));
    case LUA_TLIGHTUSERDATA: return pvalue(o);
    default: return NULL;
  }
}